

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_request_resize(Terminal *term,wchar_t cols,wchar_t rows)

{
  if ((term->cols != cols) || (term->rows != rows)) {
    term->win_resize_pending = ABOUT_TO;
    term->win_resize_pending_w = cols;
    term->win_resize_pending_h = rows;
    if (term->window_update_pending == false) {
      term->window_update_pending = true;
      queue_toplevel_callback(term_update_callback,term);
      return;
    }
  }
  return;
}

Assistant:

static void term_request_resize(Terminal *term, int cols, int rows)
{
    if (term->cols == cols && term->rows == rows)
        return;                        /* don't need to do anything */

    term->win_resize_pending = WIN_RESIZE_NEED_SEND;
    term->win_resize_pending_w = cols;
    term->win_resize_pending_h = rows;
    term_schedule_update(term);
}